

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

void __thiscall cmFileLockPool::PopFileScope(cmFileLockPool *this)

{
  ScopePool *this_00;
  bool bVar1;
  reference ppSVar2;
  cmFileLockPool *this_local;
  
  bVar1 = std::__cxx11::
          list<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::empty
                    (&this->FileScopes);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!this->FileScopes.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmFileLockPool.cxx"
                  ,0x32,"void cmFileLockPool::PopFileScope()");
  }
  ppSVar2 = std::__cxx11::
            list<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::back
                      (&this->FileScopes);
  this_00 = *ppSVar2;
  if (this_00 != (ScopePool *)0x0) {
    ScopePool::~ScopePool(this_00);
    operator_delete(this_00,0x18);
  }
  std::__cxx11::list<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::
  pop_back(&this->FileScopes);
  return;
}

Assistant:

void cmFileLockPool::PopFileScope()
{
  assert(!this->FileScopes.empty());
  delete this->FileScopes.back();
  this->FileScopes.pop_back();
}